

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

int __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::EncodeHole
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          CornerIndex start_corner_id,bool encode_first_vertex)

{
  uint uVar1;
  ulong *puVar2;
  int iVar3;
  _Bit_type *p_Var4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  CornerTable *pCVar10;
  uint uVar11;
  
  if (start_corner_id.value_ == 0xffffffff) {
    pCVar10 = (this->corner_table_)._M_t.
              super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
              _M_t.
              super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
              .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    uVar11 = 0xffffffff;
    bVar5 = true;
LAB_0013d271:
    uVar9 = 0xffffffff;
  }
  else {
    pCVar10 = (this->corner_table_)._M_t.
              super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
              _M_t.
              super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
              .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    if (start_corner_id.value_ * -0x55555555 < 0x55555556) {
      uVar11 = start_corner_id.value_ + 2;
      if (uVar11 != 0xffffffff) goto LAB_0013d232;
      uVar11 = 0xffffffff;
      bVar5 = true;
    }
    else {
      uVar11 = start_corner_id.value_ - 1;
LAB_0013d232:
      do {
        iVar3 = *(int *)(*(long *)&(pCVar10->opposite_corners_).vector_.
                                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                        + (ulong)uVar11 * 4);
        bVar5 = iVar3 != -1;
        if (iVar3 == -1) goto LAB_0013d26c;
        uVar11 = iVar3 - 2;
        if (0x55555555 < (iVar3 + 1U) * -0x55555555) {
          uVar11 = iVar3 + 1U;
        }
      } while (uVar11 != 0xffffffff);
      uVar11 = 0xffffffff;
LAB_0013d26c:
      if (start_corner_id.value_ == 0xffffffff) goto LAB_0013d271;
    }
    uVar9 = *(uint *)(*(long *)&(pCVar10->corner_to_vertex_map_).vector_ +
                     (ulong)start_corner_id.value_ * 4);
  }
  if (encode_first_vertex) {
    puVar2 = (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar9 >> 6);
    *puVar2 = *puVar2 | 1L << ((byte)uVar9 & 0x3f);
  }
  uVar6 = (uint)encode_first_vertex;
  iVar3 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9];
  iVar8 = iVar3 + 0x3f;
  if (-1 < (long)iVar3) {
    iVar8 = iVar3;
  }
  puVar2 = (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           (long)(iVar8 >> 6) +
           (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar2 = *puVar2 | 1L << ((byte)iVar3 & 0x3f);
  uVar7 = 0xffffffff;
  if (!bVar5) {
    if (uVar11 * -0x55555555 < 0x55555556) {
      uVar1 = uVar11 + 2;
      if (uVar1 == 0xffffffff) goto LAB_0013d32f;
    }
    else {
      uVar1 = uVar11 - 1;
    }
    uVar7 = *(uint *)(*(long *)&(pCVar10->corner_to_vertex_map_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                ._M_impl + (ulong)uVar1 * 4);
  }
LAB_0013d32f:
  if (uVar7 != uVar9) {
    p_Var4 = (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      puVar2 = p_Var4 + (uVar7 >> 6);
      *puVar2 = *puVar2 | 1L << ((byte)uVar7 & 0x3f);
      uVar7 = 0xffffffff;
      if (uVar11 != 0xffffffff) {
        uVar1 = uVar11 + 1;
        uVar11 = uVar11 - 2;
        if (0x55555555 < uVar1 * -0x55555555) {
          uVar11 = uVar1;
        }
        if (uVar11 != 0xffffffff) {
          do {
            iVar3 = *(int *)(*(long *)&(pCVar10->opposite_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data + (ulong)uVar11 * 4);
            if (iVar3 == -1) {
              if (uVar11 * -0x55555555 < 0x55555556) {
                uVar1 = uVar11 + 2;
                if (uVar1 == 0xffffffff) {
                  uVar11 = 0xfffffffd;
                  goto LAB_0013d361;
                }
              }
              else {
                uVar1 = uVar11 - 1;
              }
              uVar7 = *(uint *)(*(long *)&(pCVar10->corner_to_vertex_map_).vector_.
                                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                          ._M_impl + (ulong)uVar1 * 4);
              goto LAB_0013d361;
            }
            uVar11 = iVar3 - 2;
            if (0x55555555 < (iVar3 + 1U) * -0x55555555) {
              uVar11 = iVar3 + 1U;
            }
          } while (uVar11 != 0xffffffff);
        }
      }
      uVar11 = 0xffffffff;
LAB_0013d361:
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar9);
  }
  return uVar6;
}

Assistant:

int MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeHole(
    CornerIndex start_corner_id, bool encode_first_vertex) {
  // We know that the start corner lies on a hole but we first need to find the
  // boundary edge going from that vertex. It is the first edge in CW
  // direction.
  CornerIndex corner_id = start_corner_id;
  corner_id = corner_table_->Previous(corner_id);
  while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
    corner_id = corner_table_->Opposite(corner_id);
    corner_id = corner_table_->Next(corner_id);
  }
  const VertexIndex start_vertex_id = corner_table_->Vertex(start_corner_id);

  int num_encoded_hole_verts = 0;
  if (encode_first_vertex) {
    visited_vertex_ids_[start_vertex_id.value()] = true;
    ++num_encoded_hole_verts;
  }

  // corner_id is now opposite to the boundary edge.
  // Mark the hole as visited.
  visited_holes_[vertex_hole_id_[start_vertex_id.value()]] = true;
  // Get the start vertex of the edge and use it as a reference.
  VertexIndex start_vert_id =
      corner_table_->Vertex(corner_table_->Next(corner_id));
  // Get the end vertex of the edge.
  VertexIndex act_vertex_id =
      corner_table_->Vertex(corner_table_->Previous(corner_id));
  while (act_vertex_id != start_vertex_id) {
    // Encode the end vertex of the boundary edge.

    start_vert_id = act_vertex_id;

    // Mark the vertex as visited.
    visited_vertex_ids_[act_vertex_id.value()] = true;
    ++num_encoded_hole_verts;
    corner_id = corner_table_->Next(corner_id);
    // Look for the next attached open boundary edge.
    while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
      corner_id = corner_table_->Opposite(corner_id);
      corner_id = corner_table_->Next(corner_id);
    }
    act_vertex_id = corner_table_->Vertex(corner_table_->Previous(corner_id));
  }
  return num_encoded_hole_verts;
}